

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_variable_boolean *
pugi::impl::anon_unknown_0::
new_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_boolean>(char_t *name)

{
  size_t sVar1;
  xpath_variable_boolean *result;
  void *memory;
  size_t length;
  char_t *name_local;
  
  sVar1 = strlength(name);
  if (sVar1 == 0) {
    name_local = (char_t *)0x0;
  }
  else {
    name_local = (char_t *)
                 (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                           allocate)(sVar1 + 0x18);
    if ((xpath_variable_boolean *)name_local == (xpath_variable_boolean *)0x0) {
      name_local = (char_t *)0x0;
    }
    else {
      xpath_variable_boolean::xpath_variable_boolean((xpath_variable_boolean *)name_local);
      memcpy(((xpath_variable_boolean *)name_local)->name,name,sVar1 + 1);
    }
  }
  return (xpath_variable_boolean *)name_local;
}

Assistant:

PUGI__FN T* new_xpath_variable(const char_t* name)
	{
		size_t length = strlength(name);
		if (length == 0) return 0; // empty variable names are invalid

		// $$ we can't use offsetof(T, name) because T is non-POD, so we just allocate additional length characters
		void* memory = xml_memory::allocate(sizeof(T) + length * sizeof(char_t));
		if (!memory) return 0;

		T* result = new (memory) T();

		memcpy(result->name, name, (length + 1) * sizeof(char_t));

		return result;
	}